

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaAllocator_T::ImportVulkanFunctions_Dynamic(VmaAllocator_T *this)

{
  PFN_vkGetPhysicalDeviceProperties p_Var1;
  PFN_vkGetPhysicalDeviceMemoryProperties p_Var2;
  PFN_vkAllocateMemory p_Var3;
  PFN_vkFreeMemory p_Var4;
  PFN_vkMapMemory p_Var5;
  PFN_vkUnmapMemory p_Var6;
  PFN_vkFlushMappedMemoryRanges p_Var7;
  PFN_vkInvalidateMappedMemoryRanges p_Var8;
  PFN_vkBindBufferMemory p_Var9;
  PFN_vkBindImageMemory p_Var10;
  PFN_vkGetBufferMemoryRequirements p_Var11;
  PFN_vkGetImageMemoryRequirements p_Var12;
  PFN_vkCreateBuffer p_Var13;
  PFN_vkDestroyBuffer p_Var14;
  PFN_vkCreateImage p_Var15;
  PFN_vkDestroyImage p_Var16;
  PFN_vkCmdCopyBuffer p_Var17;
  PFN_vkGetBufferMemoryRequirements2KHR p_Var18;
  PFN_vkGetImageMemoryRequirements2KHR p_Var19;
  PFN_vkBindBufferMemory2KHR p_Var20;
  PFN_vkBindImageMemory2KHR p_Var21;
  PFN_vkGetPhysicalDeviceMemoryProperties2KHR p_Var22;
  PFN_vkGetDeviceBufferMemoryRequirements p_Var23;
  PFN_vkGetDeviceImageMemoryRequirements p_Var24;
  
  if ((this->m_VulkanFunctions).vkGetPhysicalDeviceProperties ==
      (PFN_vkGetPhysicalDeviceProperties)0x0) {
    p_Var1 = (PFN_vkGetPhysicalDeviceProperties)
             (*(this->m_VulkanFunctions).vkGetInstanceProcAddr)
                       (this->m_hInstance,"vkGetPhysicalDeviceProperties");
    (this->m_VulkanFunctions).vkGetPhysicalDeviceProperties = p_Var1;
  }
  if ((this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties ==
      (PFN_vkGetPhysicalDeviceMemoryProperties)0x0) {
    p_Var2 = (PFN_vkGetPhysicalDeviceMemoryProperties)
             (*(this->m_VulkanFunctions).vkGetInstanceProcAddr)
                       (this->m_hInstance,"vkGetPhysicalDeviceMemoryProperties");
    (this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties = p_Var2;
  }
  if ((this->m_VulkanFunctions).vkAllocateMemory == (PFN_vkAllocateMemory)0x0) {
    p_Var3 = (PFN_vkAllocateMemory)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkAllocateMemory");
    (this->m_VulkanFunctions).vkAllocateMemory = p_Var3;
  }
  if ((this->m_VulkanFunctions).vkFreeMemory == (PFN_vkFreeMemory)0x0) {
    p_Var4 = (PFN_vkFreeMemory)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkFreeMemory");
    (this->m_VulkanFunctions).vkFreeMemory = p_Var4;
  }
  if ((this->m_VulkanFunctions).vkMapMemory == (PFN_vkMapMemory)0x0) {
    p_Var5 = (PFN_vkMapMemory)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkMapMemory");
    (this->m_VulkanFunctions).vkMapMemory = p_Var5;
  }
  if ((this->m_VulkanFunctions).vkUnmapMemory == (PFN_vkUnmapMemory)0x0) {
    p_Var6 = (PFN_vkUnmapMemory)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkUnmapMemory");
    (this->m_VulkanFunctions).vkUnmapMemory = p_Var6;
  }
  if ((this->m_VulkanFunctions).vkFlushMappedMemoryRanges == (PFN_vkFlushMappedMemoryRanges)0x0) {
    p_Var7 = (PFN_vkFlushMappedMemoryRanges)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                       (this->m_hDevice,"vkFlushMappedMemoryRanges");
    (this->m_VulkanFunctions).vkFlushMappedMemoryRanges = p_Var7;
  }
  if ((this->m_VulkanFunctions).vkInvalidateMappedMemoryRanges ==
      (PFN_vkInvalidateMappedMemoryRanges)0x0) {
    p_Var8 = (PFN_vkInvalidateMappedMemoryRanges)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                       (this->m_hDevice,"vkInvalidateMappedMemoryRanges");
    (this->m_VulkanFunctions).vkInvalidateMappedMemoryRanges = p_Var8;
  }
  if ((this->m_VulkanFunctions).vkBindBufferMemory == (PFN_vkBindBufferMemory)0x0) {
    p_Var9 = (PFN_vkBindBufferMemory)
             (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkBindBufferMemory");
    (this->m_VulkanFunctions).vkBindBufferMemory = p_Var9;
  }
  if ((this->m_VulkanFunctions).vkBindImageMemory == (PFN_vkBindImageMemory)0x0) {
    p_Var10 = (PFN_vkBindImageMemory)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkBindImageMemory");
    (this->m_VulkanFunctions).vkBindImageMemory = p_Var10;
  }
  if ((this->m_VulkanFunctions).vkGetBufferMemoryRequirements ==
      (PFN_vkGetBufferMemoryRequirements)0x0) {
    p_Var11 = (PFN_vkGetBufferMemoryRequirements)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                        (this->m_hDevice,"vkGetBufferMemoryRequirements");
    (this->m_VulkanFunctions).vkGetBufferMemoryRequirements = p_Var11;
  }
  if ((this->m_VulkanFunctions).vkGetImageMemoryRequirements ==
      (PFN_vkGetImageMemoryRequirements)0x0) {
    p_Var12 = (PFN_vkGetImageMemoryRequirements)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                        (this->m_hDevice,"vkGetImageMemoryRequirements");
    (this->m_VulkanFunctions).vkGetImageMemoryRequirements = p_Var12;
  }
  if ((this->m_VulkanFunctions).vkCreateBuffer == (PFN_vkCreateBuffer)0x0) {
    p_Var13 = (PFN_vkCreateBuffer)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkCreateBuffer");
    (this->m_VulkanFunctions).vkCreateBuffer = p_Var13;
  }
  if ((this->m_VulkanFunctions).vkDestroyBuffer == (PFN_vkDestroyBuffer)0x0) {
    p_Var14 = (PFN_vkDestroyBuffer)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkDestroyBuffer");
    (this->m_VulkanFunctions).vkDestroyBuffer = p_Var14;
  }
  if ((this->m_VulkanFunctions).vkCreateImage == (PFN_vkCreateImage)0x0) {
    p_Var15 = (PFN_vkCreateImage)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkCreateImage");
    (this->m_VulkanFunctions).vkCreateImage = p_Var15;
  }
  if ((this->m_VulkanFunctions).vkDestroyImage == (PFN_vkDestroyImage)0x0) {
    p_Var16 = (PFN_vkDestroyImage)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkDestroyImage");
    (this->m_VulkanFunctions).vkDestroyImage = p_Var16;
  }
  if ((this->m_VulkanFunctions).vkCmdCopyBuffer == (PFN_vkCmdCopyBuffer)0x0) {
    p_Var17 = (PFN_vkCmdCopyBuffer)
              (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)(this->m_hDevice,"vkCmdCopyBuffer");
    (this->m_VulkanFunctions).vkCmdCopyBuffer = p_Var17;
  }
  if (0x400fff < this->m_VulkanApiVersion) {
    if ((this->m_VulkanFunctions).vkGetBufferMemoryRequirements2KHR ==
        (PFN_vkGetBufferMemoryRequirements2KHR)0x0) {
      p_Var18 = (PFN_vkGetBufferMemoryRequirements2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetBufferMemoryRequirements2");
      (this->m_VulkanFunctions).vkGetBufferMemoryRequirements2KHR = p_Var18;
    }
    if ((this->m_VulkanFunctions).vkGetImageMemoryRequirements2KHR ==
        (PFN_vkGetImageMemoryRequirements2KHR)0x0) {
      p_Var19 = (PFN_vkGetImageMemoryRequirements2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetImageMemoryRequirements2");
      (this->m_VulkanFunctions).vkGetImageMemoryRequirements2KHR = p_Var19;
    }
    if ((this->m_VulkanFunctions).vkBindBufferMemory2KHR == (PFN_vkBindBufferMemory2KHR)0x0) {
      p_Var20 = (PFN_vkBindBufferMemory2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkBindBufferMemory2");
      (this->m_VulkanFunctions).vkBindBufferMemory2KHR = p_Var20;
    }
    if ((this->m_VulkanFunctions).vkBindImageMemory2KHR == (PFN_vkBindImageMemory2KHR)0x0) {
      p_Var21 = (PFN_vkBindImageMemory2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkBindImageMemory2");
      (this->m_VulkanFunctions).vkBindImageMemory2KHR = p_Var21;
    }
    if ((this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties2KHR ==
        (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)0x0) {
      p_Var22 = (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)
                (*(this->m_VulkanFunctions).vkGetInstanceProcAddr)
                          (this->m_hInstance,"vkGetPhysicalDeviceMemoryProperties2");
      (this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties2KHR = p_Var22;
    }
  }
  if (this->m_UseKhrDedicatedAllocation == true) {
    if ((this->m_VulkanFunctions).vkGetBufferMemoryRequirements2KHR ==
        (PFN_vkGetBufferMemoryRequirements2KHR)0x0) {
      p_Var18 = (PFN_vkGetBufferMemoryRequirements2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetBufferMemoryRequirements2KHR");
      (this->m_VulkanFunctions).vkGetBufferMemoryRequirements2KHR = p_Var18;
    }
    if ((this->m_VulkanFunctions).vkGetImageMemoryRequirements2KHR ==
        (PFN_vkGetImageMemoryRequirements2KHR)0x0) {
      p_Var19 = (PFN_vkGetImageMemoryRequirements2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetImageMemoryRequirements2KHR");
      (this->m_VulkanFunctions).vkGetImageMemoryRequirements2KHR = p_Var19;
    }
  }
  if (this->m_UseKhrBindMemory2 == true) {
    if ((this->m_VulkanFunctions).vkBindBufferMemory2KHR == (PFN_vkBindBufferMemory2KHR)0x0) {
      p_Var20 = (PFN_vkBindBufferMemory2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkBindBufferMemory2KHR");
      (this->m_VulkanFunctions).vkBindBufferMemory2KHR = p_Var20;
    }
    if ((this->m_VulkanFunctions).vkBindImageMemory2KHR == (PFN_vkBindImageMemory2KHR)0x0) {
      p_Var21 = (PFN_vkBindImageMemory2KHR)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkBindImageMemory2KHR");
      (this->m_VulkanFunctions).vkBindImageMemory2KHR = p_Var21;
    }
  }
  if ((this->m_UseExtMemoryBudget == true) &&
     ((this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties2KHR ==
      (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)0x0)) {
    p_Var22 = (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)
              (*(this->m_VulkanFunctions).vkGetInstanceProcAddr)
                        (this->m_hInstance,"vkGetPhysicalDeviceMemoryProperties2KHR");
    (this->m_VulkanFunctions).vkGetPhysicalDeviceMemoryProperties2KHR = p_Var22;
  }
  if (0x402fff < this->m_VulkanApiVersion) {
    if ((this->m_VulkanFunctions).vkGetDeviceBufferMemoryRequirements ==
        (PFN_vkGetDeviceBufferMemoryRequirements)0x0) {
      p_Var23 = (PFN_vkGetDeviceBufferMemoryRequirements)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetDeviceBufferMemoryRequirements");
      (this->m_VulkanFunctions).vkGetDeviceBufferMemoryRequirements = p_Var23;
    }
    if ((this->m_VulkanFunctions).vkGetDeviceImageMemoryRequirements ==
        (PFN_vkGetDeviceImageMemoryRequirements)0x0) {
      p_Var24 = (PFN_vkGetDeviceImageMemoryRequirements)
                (*(this->m_VulkanFunctions).vkGetDeviceProcAddr)
                          (this->m_hDevice,"vkGetDeviceImageMemoryRequirements");
      (this->m_VulkanFunctions).vkGetDeviceImageMemoryRequirements = p_Var24;
    }
  }
  return;
}

Assistant:

void VmaAllocator_T::ImportVulkanFunctions_Dynamic()
{
    VMA_ASSERT(m_VulkanFunctions.vkGetInstanceProcAddr && m_VulkanFunctions.vkGetDeviceProcAddr &&
        "To use VMA_DYNAMIC_VULKAN_FUNCTIONS in new versions of VMA you now have to pass "
        "VmaVulkanFunctions::vkGetInstanceProcAddr and vkGetDeviceProcAddr as VmaAllocatorCreateInfo::pVulkanFunctions. "
        "Other members can be null.");

#define VMA_FETCH_INSTANCE_FUNC(memberName, functionPointerType, functionNameString) \
    if(m_VulkanFunctions.memberName == VMA_NULL) \
        m_VulkanFunctions.memberName = \
            (functionPointerType)m_VulkanFunctions.vkGetInstanceProcAddr(m_hInstance, functionNameString);
#define VMA_FETCH_DEVICE_FUNC(memberName, functionPointerType, functionNameString) \
    if(m_VulkanFunctions.memberName == VMA_NULL) \
        m_VulkanFunctions.memberName = \
            (functionPointerType)m_VulkanFunctions.vkGetDeviceProcAddr(m_hDevice, functionNameString);

    VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceProperties, PFN_vkGetPhysicalDeviceProperties, "vkGetPhysicalDeviceProperties");
    VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties, PFN_vkGetPhysicalDeviceMemoryProperties, "vkGetPhysicalDeviceMemoryProperties");
    VMA_FETCH_DEVICE_FUNC(vkAllocateMemory, PFN_vkAllocateMemory, "vkAllocateMemory");
    VMA_FETCH_DEVICE_FUNC(vkFreeMemory, PFN_vkFreeMemory, "vkFreeMemory");
    VMA_FETCH_DEVICE_FUNC(vkMapMemory, PFN_vkMapMemory, "vkMapMemory");
    VMA_FETCH_DEVICE_FUNC(vkUnmapMemory, PFN_vkUnmapMemory, "vkUnmapMemory");
    VMA_FETCH_DEVICE_FUNC(vkFlushMappedMemoryRanges, PFN_vkFlushMappedMemoryRanges, "vkFlushMappedMemoryRanges");
    VMA_FETCH_DEVICE_FUNC(vkInvalidateMappedMemoryRanges, PFN_vkInvalidateMappedMemoryRanges, "vkInvalidateMappedMemoryRanges");
    VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory, PFN_vkBindBufferMemory, "vkBindBufferMemory");
    VMA_FETCH_DEVICE_FUNC(vkBindImageMemory, PFN_vkBindImageMemory, "vkBindImageMemory");
    VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements, PFN_vkGetBufferMemoryRequirements, "vkGetBufferMemoryRequirements");
    VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements, PFN_vkGetImageMemoryRequirements, "vkGetImageMemoryRequirements");
    VMA_FETCH_DEVICE_FUNC(vkCreateBuffer, PFN_vkCreateBuffer, "vkCreateBuffer");
    VMA_FETCH_DEVICE_FUNC(vkDestroyBuffer, PFN_vkDestroyBuffer, "vkDestroyBuffer");
    VMA_FETCH_DEVICE_FUNC(vkCreateImage, PFN_vkCreateImage, "vkCreateImage");
    VMA_FETCH_DEVICE_FUNC(vkDestroyImage, PFN_vkDestroyImage, "vkDestroyImage");
    VMA_FETCH_DEVICE_FUNC(vkCmdCopyBuffer, PFN_vkCmdCopyBuffer, "vkCmdCopyBuffer");

#if VMA_VULKAN_VERSION >= 1001000
    if(m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0))
    {
        VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements2KHR, PFN_vkGetBufferMemoryRequirements2, "vkGetBufferMemoryRequirements2");
        VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements2KHR, PFN_vkGetImageMemoryRequirements2, "vkGetImageMemoryRequirements2");
        VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory2KHR, PFN_vkBindBufferMemory2, "vkBindBufferMemory2");
        VMA_FETCH_DEVICE_FUNC(vkBindImageMemory2KHR, PFN_vkBindImageMemory2, "vkBindImageMemory2");
        VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties2KHR, PFN_vkGetPhysicalDeviceMemoryProperties2, "vkGetPhysicalDeviceMemoryProperties2");
    }
#endif

#if VMA_DEDICATED_ALLOCATION
    if(m_UseKhrDedicatedAllocation)
    {
        VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements2KHR, PFN_vkGetBufferMemoryRequirements2KHR, "vkGetBufferMemoryRequirements2KHR");
        VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements2KHR, PFN_vkGetImageMemoryRequirements2KHR, "vkGetImageMemoryRequirements2KHR");
    }
#endif

#if VMA_BIND_MEMORY2
    if(m_UseKhrBindMemory2)
    {
        VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory2KHR, PFN_vkBindBufferMemory2KHR, "vkBindBufferMemory2KHR");
        VMA_FETCH_DEVICE_FUNC(vkBindImageMemory2KHR, PFN_vkBindImageMemory2KHR, "vkBindImageMemory2KHR");
    }
#endif // #if VMA_BIND_MEMORY2

#if VMA_MEMORY_BUDGET
    if(m_UseExtMemoryBudget)
    {
        VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties2KHR, PFN_vkGetPhysicalDeviceMemoryProperties2KHR, "vkGetPhysicalDeviceMemoryProperties2KHR");
    }
#endif // #if VMA_MEMORY_BUDGET

#if VMA_VULKAN_VERSION >= 1003000
    if(m_VulkanApiVersion >= VK_MAKE_VERSION(1, 3, 0))
    {
        VMA_FETCH_DEVICE_FUNC(vkGetDeviceBufferMemoryRequirements, PFN_vkGetDeviceBufferMemoryRequirements, "vkGetDeviceBufferMemoryRequirements");
        VMA_FETCH_DEVICE_FUNC(vkGetDeviceImageMemoryRequirements, PFN_vkGetDeviceImageMemoryRequirements, "vkGetDeviceImageMemoryRequirements");
    }
#endif

#undef VMA_FETCH_DEVICE_FUNC
#undef VMA_FETCH_INSTANCE_FUNC
}